

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool cmsys::SystemTools::ParseURLProtocol(string *URL,string *protocol,string *dataglom)

{
  bool bVar1;
  RegularExpression urlRe;
  undefined1 *local_110;
  undefined8 local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  RegularExpression local_f0;
  
  local_f0.program = (char *)0x0;
  RegularExpression::compile(&local_f0,"([a-zA-Z0-9]*)://(.*)");
  bVar1 = RegularExpression::find(&local_f0,(URL->_M_dataplus)._M_p);
  if (bVar1) {
    if (local_f0.startp[1] == (char *)0x0) {
      local_110 = &local_100;
      local_108 = 0;
      local_100 = 0;
    }
    else {
      local_110 = &local_100;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,local_f0.startp[1],local_f0.endp[1]);
    }
    std::__cxx11::string::operator=((string *)protocol,(string *)&local_110);
    if (local_110 != &local_100) {
      operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
    }
    local_110 = &local_100;
    if (local_f0.startp[2] == (char *)0x0) {
      local_108 = 0;
      local_100 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,local_f0.startp[2],local_f0.endp[2]);
    }
    std::__cxx11::string::operator=((string *)dataglom,(string *)&local_110);
    if (local_110 != &local_100) {
      operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
    }
  }
  if (local_f0.program != (char *)0x0) {
    operator_delete__(local_f0.program);
  }
  return bVar1;
}

Assistant:

bool SystemTools::ParseURLProtocol( const kwsys_stl::string& URL,
                                    kwsys_stl::string& protocol,
                                    kwsys_stl::string& dataglom )
{
  // match 0 entire url
  // match 1 protocol
  // match 2 dataglom following protocol://
  kwsys::RegularExpression urlRe( VTK_URL_PROTOCOL_REGEX );

  if ( ! urlRe.find( URL ) ) return false;

  protocol = urlRe.match( 1 );
  dataglom = urlRe.match( 2 );

  return true;
}